

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_eval(_binbuf *x,t_pd *target,int argc,t_atom *argv)

{
  uint uVar1;
  t_atom *ptVar2;
  t_atomtype *ptVar3;
  char **ppcVar4;
  undefined8 uVar5;
  t_gpointer *gp;
  bool bVar6;
  int iVar7;
  long lVar8;
  t_atom *argv_00;
  t_symbol *ptVar9;
  t_atom *a;
  int iVar10;
  ulong uVar11;
  t_atom *ptVar12;
  char *pcVar13;
  char *fmt;
  int argc_00;
  _class **x_00;
  t_pd *pp_Var14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  t_atom *ptVar19;
  t_atomtype tVar20;
  t_atomtype tVar21;
  t_float tVar22;
  t_atomtype tVar23;
  undefined1 local_c8 [8];
  t_atom smallstack [5];
  
  a = x->b_vec;
  uVar16 = x->b_n;
  uVar11 = (ulong)uVar16;
  argv_00 = (t_atom *)local_c8;
  ptVar12 = (t_atom *)local_c8;
  uVar18 = 0;
  if (5 < (int)uVar16) {
    if (target != &pd_objectmaker) {
      lVar8 = 0;
      uVar18 = -(uint)(target == (t_pd *)0x0);
      uVar16 = 0;
      uVar17 = uVar16;
      do {
        iVar10 = *(int *)((long)&a->a_type + lVar8);
        if (iVar10 == 4) {
          uVar18 = 0xffffffff;
        }
        else if (iVar10 == 5) {
          uVar18 = 0;
        }
        else {
          uVar1 = uVar18 + 1;
          bVar6 = (int)uVar16 <= (int)uVar18;
          uVar16 = uVar17;
          uVar18 = uVar1;
          if (bVar6) {
            uVar16 = uVar1;
            uVar17 = uVar1;
          }
        }
        lVar8 = lVar8 + 0x10;
      } while (uVar11 << 4 != lVar8);
      ptVar12 = (t_atom *)local_c8;
      uVar18 = uVar16;
      if ((int)uVar16 < 6) goto LAB_00168b2d;
    }
    uVar18 = uVar16;
    if (uVar16 < 1000) {
      argv_00 = (t_atom *)(local_c8 + -(ulong)(uVar16 << 4));
      ptVar12 = argv_00;
    }
    else {
      argv_00 = (t_atom *)getbytes((ulong)uVar16 << 4);
      ptVar12 = (t_atom *)local_c8;
    }
  }
LAB_00168b2d:
  smallstack[4].a_w.w_symbol = (t_symbol *)(argv + -1);
  pp_Var14 = target;
  while (x_00 = pp_Var14, pp_Var14 != (t_pd *)0x0) {
LAB_00168b59:
    iVar10 = (int)uVar11;
    if (iVar10 == 0) goto LAB_00168eeb;
    lVar8 = 0;
    argc_00 = 0;
    ptVar19 = a;
    do {
      iVar15 = (int)uVar11;
      iVar7 = *(int *)((long)&a->a_type + lVar8);
      if (8 < iVar7 - 1U) {
switchD_00168bb0_caseD_3:
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168ee7;
        bug("bad item in binbuf");
        goto LAB_00168eeb;
      }
      ptVar2 = (t_atom *)((long)&a->a_type + lVar8);
      ptVar3 = (t_atomtype *)((long)&argv_00->a_type + lVar8);
      pp_Var14 = x_00;
      switch(iVar7) {
      case 1:
      case 2:
        tVar20 = ptVar2->a_type;
        tVar21 = *(t_atomtype *)&ptVar2->field_0x4;
        tVar22 = (ptVar2->a_w).w_float;
        tVar23 = *(t_atomtype *)((long)&ptVar2->a_w + 4);
LAB_00168bb5:
        *ptVar3 = tVar20;
        ptVar3[1] = tVar21;
        ptVar3[2] = (t_atomtype)tVar22;
        ptVar3[3] = tVar23;
        break;
      default:
        goto switchD_00168bb0_caseD_3;
      case 4:
        if (x_00 == &pd_objectmaker) {
          *(undefined4 *)((long)&argv_00->a_type + lVar8) = 2;
          pcVar13 = ";";
          goto LAB_00168c27;
        }
        pp_Var14 = (t_pd *)0x0;
        ptVar19 = ptVar2;
        goto LAB_00168d11;
      case 5:
        if (x_00 != &pd_objectmaker) goto LAB_00168d11;
        *(undefined4 *)((long)&argv_00->a_type + lVar8) = 2;
        pcVar13 = ",";
LAB_00168c27:
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168c2c;
        ptVar9 = gensym(pcVar13);
LAB_00168c30:
        *(t_symbol **)((long)&argv_00->a_w + lVar8) = ptVar9;
        break;
      case 8:
        uVar16 = *(uint *)((long)&a->a_w + lVar8);
        if ((int)uVar16 <= argc && 0 < (int)uVar16) {
          ppcVar4 = &(smallstack[4].a_w.w_symbol)->s_name + (ulong)uVar16 * 2;
          tVar20 = *(t_atomtype *)ppcVar4;
          tVar21 = *(t_atomtype *)((long)ppcVar4 + 4);
          tVar22 = *(t_float *)(ppcVar4 + 1);
          tVar23 = *(t_atomtype *)((long)ppcVar4 + 0xc);
          goto LAB_00168bb5;
        }
        if ((ulong)uVar16 == 0) {
          *(undefined4 *)((long)&argv_00->a_type + lVar8) = 1;
          ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168cef;
          iVar7 = canvas_getdollarzero();
          *(float *)((long)&argv_00->a_w + lVar8) = (float)iVar7;
        }
        else {
          if (x_00 != &pd_objectmaker) {
            ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168c8a;
            pd_error(x_00,"$%d: argument number out of range");
          }
          *(undefined4 *)((long)&argv_00->a_type + lVar8) = 1;
          *(undefined4 *)((long)&argv_00->a_w + lVar8) = 0;
        }
        break;
      case 9:
        ptVar9 = *(t_symbol **)((long)&a->a_w + lVar8);
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168bce;
        ptVar9 = binbuf_realizedollsym(ptVar9,argc,argv,(uint)(x_00 == &pd_objectmaker));
        if (ptVar9 == (t_symbol *)0x0) {
          uVar5 = **(undefined8 **)((long)&a->a_w + lVar8);
          ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168ccc;
          pd_error(x_00,"%s: argument number out of range",uVar5);
          *(undefined4 *)((long)&argv_00->a_type + lVar8) = 2;
          ptVar9 = *(t_symbol **)((long)&a->a_w + lVar8);
        }
        else {
          *(undefined4 *)((long)&argv_00->a_type + lVar8) = 2;
        }
        goto LAB_00168c30;
      }
      uVar11 = (ulong)(iVar15 - 1);
      ptVar19 = ptVar19 + 1;
      argc_00 = argc_00 + 1;
      lVar8 = lVar8 + 0x10;
    } while (argc_00 != iVar10);
    iVar15 = 0;
    argc_00 = iVar10;
LAB_00168d11:
    if (argc_00 != 0) {
      tVar20 = argv_00->a_type;
      if (tVar20 == A_FLOAT) {
        if (argc_00 == 1) {
          tVar22 = (argv_00->a_w).w_float;
          ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e73;
          pd_float(x_00,tVar22);
        }
        else {
LAB_00168e75:
          ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e83;
          pd_list(x_00,(t_symbol *)0x0,argc_00,argv_00);
        }
      }
      else if (tVar20 == A_POINTER) {
        if (argc_00 != 1) goto LAB_00168e75;
        gp = (argv_00->a_w).w_gpointer;
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e5d;
        pd_pointer(x_00,gp);
      }
      else if (tVar20 == A_SYMBOL) {
        ptVar9 = (argv_00->a_w).w_symbol;
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168d4e;
        pd_typedmess(x_00,ptVar9,argc_00 + -1,argv_00 + 1);
      }
      else {
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e93;
        bug("bad selector");
      }
    }
    if (iVar15 == 0) goto LAB_00168eeb;
    a = ptVar19 + 1;
    uVar11 = (ulong)(iVar15 - 1);
  }
  uVar16 = (uint)uVar11;
  while (uVar16 != 0) {
    while( true ) {
      tVar20 = a->a_type;
      if ((tVar20 & ~A_FLOAT) == A_SEMI) break;
      if (tVar20 == A_DOLLSYM) {
        ptVar9 = (a->a_w).w_symbol;
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168db4;
        ptVar9 = binbuf_realizedollsym(ptVar9,argc,argv,0);
        if (ptVar9 != (t_symbol *)0x0) goto LAB_00168df0;
        pcVar13 = ((a->a_w).w_symbol)->s_name;
        fmt = "$%s: not enough arguments supplied";
LAB_00168e0a:
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e11;
        pd_error(target,fmt,pcVar13);
      }
      else {
        if (tVar20 != A_DOLLAR) {
          ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168dd8;
          ptVar9 = atom_getsymbol(a);
LAB_00168df0:
          x_00 = ptVar9->s_thing;
          if (x_00 == (_class **)0x0) {
            pcVar13 = ptVar9->s_name;
            fmt = "%s: no such object ";
            goto LAB_00168e0a;
          }
          a = a + 1;
          uVar11 = (ulong)((int)uVar11 - 1);
          goto LAB_00168b59;
        }
        uVar16 = (a->a_w).w_index;
        if ((int)uVar16 < 1 || argc < (int)uVar16) {
          pcVar13 = "$%d: not enough arguments supplied";
        }
        else {
          if (argv[(ulong)uVar16 - 1].a_type == A_SYMBOL) {
            ptVar9 = argv[(ulong)uVar16 - 1].a_w.w_symbol;
            goto LAB_00168df0;
          }
          pcVar13 = "$%d: symbol needed as message destination";
        }
        ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168e24;
        pd_error(target,pcVar13);
      }
      do {
        if ((int)uVar11 == 1) goto LAB_00168eeb;
        ptVar19 = a + 1;
        uVar11 = (ulong)((int)uVar11 - 1);
        ptVar2 = a + 1;
        a = ptVar19;
      } while (ptVar2->a_type != A_SEMI);
    }
    a = a + 1;
    uVar16 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar16;
  }
LAB_00168eeb:
  if (999 < (int)uVar18) {
    ptVar12[-1].a_w.w_symbol = (t_symbol *)0x168f03;
    freebytes(argv_00,(ulong)uVar18 << 4);
  }
  return;
}

Assistant:

void binbuf_eval(const t_binbuf *x, t_pd *target, int argc, const t_atom *argv)
{
    t_atom smallstack[SMALLMSG], *mstack, *msp;
    const t_atom *at = x->b_vec;
    int ac = x->b_n;
    int nargs, maxnargs = 0;
    t_pd *initial_target = target;

    if (ac <= SMALLMSG)
        mstack = smallstack;
    else
    {
#if 1
            /* count number of args in biggest message.  The weird
            treatment of "pd_objectmaker" is because when the message
            goes out to objectmaker, commas and semis are passed
            on as regular args (see below).  We're tacitly assuming here
            that the pd_objectmaker target can't come up via a named
            destination in the message, only because the original "target"
            points there. */
        if (target == &pd_objectmaker)
            maxnargs = ac;
        else
        {
            int i, j = (target ? 0 : -1);
            for (i = 0; i < ac; i++)
            {
                if (at[i].a_type == A_SEMI)
                    j = -1;
                else if (at[i].a_type == A_COMMA)
                    j = 0;
                else if (++j > maxnargs)
                    maxnargs = j;
            }
        }
        if (maxnargs <= SMALLMSG)
            mstack = smallstack;
        else ATOMS_ALLOCA(mstack, maxnargs);
#else
            /* just pessimistically allocate enough to hold everything
            at once.  This turned out to run slower in a simple benchmark
            I tried, perhaps because the extra memory allocation
            hurt the cache hit rate. */
        maxnargs = ac;
        ATOMS_ALLOCA(mstack, maxnargs);
#endif

    }
    msp = mstack;
    while (1)
    {
        t_pd *nexttarget;
            /* get a target. */
        while (!target)
        {
            t_symbol *s;
            while (ac && (at->a_type == A_SEMI || at->a_type == A_COMMA))
                ac--,  at++;
            if (!ac) break;
            if (at->a_type == A_DOLLAR)
            {
                if (at->a_w.w_index <= 0 || at->a_w.w_index > argc)
                {
                    pd_error(initial_target, "$%d: not enough arguments supplied",
                            at->a_w.w_index);
                    goto cleanup;
                }
                else if (argv[at->a_w.w_index-1].a_type != A_SYMBOL)
                {
                    pd_error(initial_target, "$%d: symbol needed as message destination",
                        at->a_w.w_index);
                    goto cleanup;
                }
                else s = argv[at->a_w.w_index-1].a_w.w_symbol;
            }
            else if (at->a_type == A_DOLLSYM)
            {
                if (!(s = binbuf_realizedollsym(at->a_w.w_symbol,
                    argc, argv, 0)))
                {
                    pd_error(initial_target, "$%s: not enough arguments supplied",
                        at->a_w.w_symbol->s_name);
                    goto cleanup;
                }
            }
            else s = atom_getsymbol(at);
            if (!(target = s->s_thing))
            {
                pd_error(initial_target, "%s: no such object ", s->s_name);
            cleanup:
                do at++, ac--;
                while (ac && at->a_type != A_SEMI);
                    /* LATER eat args until semicolon and continue */
                continue;
            }
            else
            {
                at++, ac--;
                break;
            }
        }
        if (!ac) break;
        nargs = 0;
        nexttarget = target;
        while (1)
        {
            t_symbol *s9;
            if (!ac) goto gotmess;
            switch (at->a_type)
            {
            case A_SEMI:
                    /* semis and commas in new message just get bashed to
                    a symbol.  This is needed so you can pass them to "expr." */
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(";"));
                    break;
                }
                else
                {
                    nexttarget = 0;
                    goto gotmess;
                }
            case A_COMMA:
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(","));
                    break;
                }
                else goto gotmess;
            case A_FLOAT:
            case A_SYMBOL:
                *msp = *at;
                break;
            case A_DOLLAR:
                if (at->a_w.w_index > 0 && at->a_w.w_index <= argc)
                    *msp = argv[at->a_w.w_index-1];
                else if (at->a_w.w_index == 0)
                    SETFLOAT(msp, canvas_getdollarzero());
                else
                {
                    if (target == &pd_objectmaker)
                        SETFLOAT(msp, 0);
                    else
                    {
                        pd_error(target, "$%d: argument number out of range",
                            at->a_w.w_index);
                        SETFLOAT(msp, 0);
                    }
                }
                break;
            case A_DOLLSYM:
                s9 = binbuf_realizedollsym(at->a_w.w_symbol, argc, argv,
                    target == &pd_objectmaker);
                if (!s9)
                {
                    pd_error(target, "%s: argument number out of range", at->a_w.w_symbol->s_name);
                    SETSYMBOL(msp, at->a_w.w_symbol);
                }
                else SETSYMBOL(msp, s9);
                break;
            default:
                bug("bad item in binbuf");
                goto broken;
            }
            msp++;
            ac--;
            at++;
            nargs++;
        }
    gotmess:
        if (nargs)
        {
            switch (mstack->a_type)
            {
            case A_SYMBOL:
                typedmess(target, mstack->a_w.w_symbol, nargs-1, mstack+1);
                break;
            case A_FLOAT:
                if (nargs == 1) pd_float(target, mstack->a_w.w_float);
                else pd_list(target, 0, nargs, mstack);
                break;
            case A_POINTER:
                if (nargs == 1) pd_pointer(target, mstack->a_w.w_gpointer);
                else pd_list(target, 0, nargs, mstack);
                break;
            default:
                bug("bad selector");
                break;
            }
        }
        msp = mstack;
        if (!ac) break;
        target = nexttarget;
        at++;
        ac--;
    }
broken:
    if (maxnargs > SMALLMSG)
         ATOMS_FREEA(mstack, maxnargs);
}